

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
::find_or_prepare_insert_non_soo<google::protobuf::OneofDescriptor_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
          *this,OneofDescriptor **key)

{
  ctrl_t *pcVar1;
  undefined1 *capacity;
  OneofDescriptor *pOVar2;
  uint uVar3;
  ushort uVar4;
  bool bVar5;
  size_t sVar6;
  slot_type *psVar7;
  undefined1 uVar8;
  ctrl_t *pcVar9;
  uint uVar10;
  ushort uVar11;
  PolicyFunctions *pPVar12;
  PolicyFunctions *policy;
  ulong uVar13;
  ulong uVar14;
  CommonFields *common;
  __m128i match;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  FindInfo target;
  ctrl_t cVar17;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  
  pcVar9 = *(ctrl_t **)(this + 0x10);
  capacity = *(undefined1 **)this;
  if (((ulong)(capacity + 1) & (ulong)capacity) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  pOVar2 = *key;
  uVar13 = ((ulong)pOVar2 ^ 0x830380) * -0x234dd359734ecb13;
  uVar14 = ((uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
             (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
             (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
            uVar13 << 0x38) ^ (ulong)pOVar2) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 | (uVar14 & 0xff0000000000) >> 0x18
            | (uVar14 & 0xff00000000) >> 8 | (uVar14 & 0xff000000) << 8 |
            (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
  uVar13 = (ulong)common >> 7 ^ (ulong)pcVar9 >> 0xc;
  uVar8 = (undefined1)(uVar14 >> 0x38);
  auVar15 = ZEXT216(CONCAT11(uVar8,uVar8) & 0x7f7f);
  auVar15 = pshuflw(auVar15,auVar15,0);
  pPVar12 = (PolicyFunctions *)0x0;
  do {
    uVar13 = uVar13 & (ulong)capacity;
    pcVar1 = pcVar9 + uVar13;
    cVar17 = auVar15[0];
    auVar18[0] = -(cVar17 == *pcVar1);
    cVar19 = auVar15[1];
    auVar18[1] = -(cVar19 == pcVar1[1]);
    cVar20 = auVar15[2];
    auVar18[2] = -(cVar20 == pcVar1[2]);
    cVar21 = auVar15[3];
    auVar18[3] = -(cVar21 == pcVar1[3]);
    auVar18[4] = -(cVar17 == pcVar1[4]);
    auVar18[5] = -(cVar19 == pcVar1[5]);
    auVar18[6] = -(cVar20 == pcVar1[6]);
    auVar18[7] = -(cVar21 == pcVar1[7]);
    auVar18[8] = -(cVar17 == pcVar1[8]);
    auVar18[9] = -(cVar19 == pcVar1[9]);
    auVar18[10] = -(cVar20 == pcVar1[10]);
    auVar18[0xb] = -(cVar21 == pcVar1[0xb]);
    auVar18[0xc] = -(cVar17 == pcVar1[0xc]);
    auVar18[0xd] = -(cVar19 == pcVar1[0xd]);
    auVar18[0xe] = -(cVar20 == pcVar1[0xe]);
    auVar18[0xf] = -(cVar21 == pcVar1[0xf]);
    uVar11 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
    uVar10 = (uint)uVar11;
    while (uVar11 != 0) {
      uVar3 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar14 = uVar3 + uVar13 & (ulong)capacity;
      if (*(OneofDescriptor **)(*(long *)(this + 0x18) + uVar14 * 0x48) == pOVar2) {
        if (pcVar9 == (ctrl_t *)0x0) goto LAB_0029f248;
        psVar7 = (slot_type *)(*(long *)(this + 0x18) + uVar14 * 0x48);
        pcVar9 = pcVar9 + uVar14;
        bVar5 = false;
        goto LAB_0029f20d;
      }
      uVar11 = (ushort)(uVar10 - 1) & (ushort)uVar10;
      uVar10 = CONCAT22((short)(uVar10 - 1 >> 0x10),uVar11);
    }
    auVar16[0] = -(*pcVar1 == kEmpty);
    auVar16[1] = -(pcVar1[1] == kEmpty);
    auVar16[2] = -(pcVar1[2] == kEmpty);
    auVar16[3] = -(pcVar1[3] == kEmpty);
    auVar16[4] = -(pcVar1[4] == kEmpty);
    auVar16[5] = -(pcVar1[5] == kEmpty);
    auVar16[6] = -(pcVar1[6] == kEmpty);
    auVar16[7] = -(pcVar1[7] == kEmpty);
    auVar16[8] = -(pcVar1[8] == kEmpty);
    auVar16[9] = -(pcVar1[9] == kEmpty);
    auVar16[10] = -(pcVar1[10] == kEmpty);
    auVar16[0xb] = -(pcVar1[0xb] == kEmpty);
    auVar16[0xc] = -(pcVar1[0xc] == kEmpty);
    auVar16[0xd] = -(pcVar1[0xd] == kEmpty);
    auVar16[0xe] = -(pcVar1[0xe] == kEmpty);
    auVar16[0xf] = -(pcVar1[0xf] == kEmpty);
    uVar11 = (ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf;
    if (uVar11 != 0) {
      policy = pPVar12;
      bVar5 = ShouldInsertBackwardsForDebug((size_t)capacity,(size_t)common,pcVar9);
      if (bVar5) {
        uVar4 = 0xf;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar10 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar10 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = (size_t)pPVar12;
      sVar6 = PrepareInsertNonSoo((container_internal *)this,common,
                                  uVar10 + uVar13 & (ulong)capacity,target,policy);
      if (*(long *)(this + 0x10) == 0) {
LAB_0029f248:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::OneofDescriptor *const, google::protobuf::compiler::java::OneofGeneratorInfo>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, Hash = absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::OneofDescriptor *const, google::protobuf::compiler::java::OneofGeneratorInfo>>]"
                     );
      }
      pcVar9 = (ctrl_t *)(*(long *)(this + 0x10) + sVar6);
      psVar7 = (slot_type *)(sVar6 * 0x48 + *(long *)(this + 0x18));
      bVar5 = true;
LAB_0029f20d:
      (__return_storage_ptr__->first).ctrl_ = pcVar9;
      (__return_storage_ptr__->first).field_1.slot_ = psVar7;
      __return_storage_ptr__->second = bVar5;
      return __return_storage_ptr__;
    }
    uVar13 = (long)&pPVar12->hash_slot + uVar13;
    pPVar12 = (PolicyFunctions *)&pPVar12->hash_slot;
    if (capacity < pPVar12) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::OneofDescriptor *const, google::protobuf::compiler::java::OneofGeneratorInfo>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::OneofDescriptor *, google::protobuf::compiler::java::OneofGeneratorInfo>, Hash = absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::OneofDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::OneofDescriptor *const, google::protobuf::compiler::java::OneofGeneratorInfo>>, K = const google::protobuf::OneofDescriptor *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }